

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SStream.c
# Opt level: O0

void printInt32BangDec(SStream *O,int32_t val)

{
  uint in_ESI;
  SStream *in_RDI;
  
  if ((int)in_ESI < 0) {
    if (in_ESI == 0x80000000) {
      SStream_concat(in_RDI,"#-%u",0x80000000);
    }
    else {
      SStream_concat(in_RDI,"#-%u",(ulong)-in_ESI);
    }
  }
  else {
    SStream_concat(in_RDI,"#%u",(ulong)in_ESI);
  }
  return;
}

Assistant:

void printInt32BangDec(SStream *O, int32_t val)
{
	if (val >= 0)
		SStream_concat(O, "#%u", val);
	else
		if (val == INT_MIN)
			SStream_concat(O, "#-%u", val);
		else
			SStream_concat(O, "#-%u", (uint32_t)-val);
}